

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::Fault<int,kj::Path&>
          (Fault *this,char *file,int line,int code,char *condition,char *macroArgs,Path *params)

{
  char *pcVar1;
  size_t sVar2;
  String argValues [1];
  char **ppcVar3;
  undefined8 uVar4;
  char *local_88;
  size_t sStack_80;
  ArrayDisposer *pAStack_78;
  char *local_70;
  char **local_68;
  undefined8 uStack_60;
  PathPtr local_58;
  String local_48;
  
  this->exception = (Exception *)0x0;
  local_58.parts.ptr = (params->parts).ptr;
  local_58.parts.size_ = (params->parts).size_;
  local_70 = macroArgs;
  PathPtr::toString(&local_48,&local_58,false);
  ppcVar3 = &local_88;
  local_88 = local_48.content.ptr;
  sStack_80 = local_48.content.size_;
  pAStack_78 = local_48.content.disposer;
  uStack_60 = 1;
  uVar4 = 1;
  local_68 = ppcVar3;
  init(this,(EVP_PKEY_CTX *)file);
  sVar2 = sStack_80;
  pcVar1 = local_88;
  if (local_88 != (char *)0x0) {
    local_88 = (char *)0x0;
    sStack_80 = 0;
    (**pAStack_78->_vptr_ArrayDisposer)(pAStack_78,pcVar1,1,sVar2,sVar2,0,ppcVar3,uVar4);
  }
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}